

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O2

void __thiscall Hes_Osc::run_until(Hes_Osc *this,synth_t *synth_,blip_time_t end_time)

{
  Blip_Buffer *buf;
  Blip_Buffer *buf_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint t;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  buf = this->outputs[0];
  if ((buf != (Blip_Buffer *)0x0) && ((char)this->control < '\0')) {
    bVar1 = this->dac;
    uVar8 = (uint)bVar1;
    iVar2 = (int)this->volume[0];
    iVar3 = iVar2 * (uint)bVar1 - this->last_amp[0];
    if (iVar3 != 0) {
      Blip_Synth<8,_1>::offset(synth_,this->last_time,iVar3,buf);
    }
    buf->modified_ = 1;
    buf_00 = this->outputs[1];
    iVar3 = (int)this->volume[1];
    if (buf_00 != (Blip_Buffer *)0x0) {
      iVar4 = iVar3 * (uint)bVar1 - this->last_amp[1];
      if (iVar4 != 0) {
        Blip_Synth<8,_1>::offset(synth_,this->last_time,iVar4,buf_00);
      }
      buf_00->modified_ = 1;
    }
    t = this->delay + this->last_time;
    if ((int)t < end_time) {
      bVar1 = this->noise;
      if ((char)bVar1 < '\0') {
        if (iVar3 != 0 || iVar2 != 0) {
          uVar5 = this->noise_lfsr;
          do {
            uVar7 = (int)(uVar5 << 0x1e) >> 0x1f & 0x1f;
            iVar4 = uVar7 - uVar8;
            if ((iVar4 != 0) &&
               (Blip_Synth<8,_1>::offset(synth_,t,iVar4 * iVar2,buf), uVar8 = uVar7,
               buf_00 != (Blip_Buffer *)0x0)) {
              Blip_Synth<8,_1>::offset(synth_,t,iVar4 * iVar3,buf_00);
            }
            uVar5 = -(uVar5 & 1) & 0xe008 ^ uVar5 >> 1;
            t = t + (0x20 - (bVar1 & 0x1f)) * 0x40;
          } while ((int)t < end_time);
          this->noise_lfsr = uVar5;
        }
      }
      else if ((this->control & 0x40) == 0) {
        bVar1 = this->phase + 1 & 0x1f;
        uVar5 = (uint)bVar1;
        iVar4 = this->period;
        iVar6 = iVar4 * 2;
        if (iVar3 == 0 && iVar2 == 0 || iVar4 < 7) {
          if (iVar4 == 0) {
            iVar6 = 1;
          }
          iVar4 = (int)(~t + end_time + iVar6) / iVar6;
          uVar5 = (uint)bVar1 + iVar4;
          t = t + iVar6 * iVar4;
        }
        else {
          do {
            uVar7 = (uint)this->wave[uVar5];
            iVar4 = uVar7 - uVar8;
            if ((iVar4 != 0) &&
               (Blip_Synth<8,_1>::offset(synth_,t,iVar4 * iVar2,buf), uVar8 = uVar7,
               buf_00 != (Blip_Buffer *)0x0)) {
              Blip_Synth<8,_1>::offset(synth_,t,iVar4 * iVar3,buf_00);
            }
            uVar5 = uVar5 + 1 & 0x1f;
            t = t + iVar6;
          } while ((int)t < end_time);
        }
        this->phase = (char)uVar5 - 1U & 0x1f;
      }
    }
    iVar4 = 0;
    if (0 < (int)(t - end_time)) {
      iVar4 = t - end_time;
    }
    this->delay = iVar4;
    this->dac = (uchar)uVar8;
    this->last_amp[0] = iVar2 * uVar8;
    this->last_amp[1] = iVar3 * uVar8;
  }
  this->last_time = end_time;
  return;
}

Assistant:

void Hes_Osc::run_until( synth_t& synth_, blip_time_t end_time )
{
	Blip_Buffer* const osc_outputs_0 = outputs [0]; // cache often-used values
	if ( osc_outputs_0 && control & 0x80 )
	{
		int dac = this->dac;
		
		int const volume_0 = volume [0];
		{
			int delta = dac * volume_0 - last_amp [0];
			if ( delta )
				synth_.offset( last_time, delta, osc_outputs_0 );
			osc_outputs_0->set_modified();
		}
		
		Blip_Buffer* const osc_outputs_1 = outputs [1];
		int const volume_1 = volume [1];
		if ( osc_outputs_1 )
		{
			int delta = dac * volume_1 - last_amp [1];
			if ( delta )
				synth_.offset( last_time, delta, osc_outputs_1 );
			osc_outputs_1->set_modified();
		}
		
		blip_time_t time = last_time + delay;
		if ( time < end_time )
		{
			if ( noise & 0x80 )
			{
				if ( volume_0 | volume_1 )
				{
					// noise
					int const period = (32 - (noise & 0x1F)) * 64; // TODO: correct?
					unsigned noise_lfsr = this->noise_lfsr;
					do
					{
						int new_dac = 0x1F & (unsigned)-(int)(noise_lfsr >> 1 & 1);
						// Implemented using "Galios configuration"
						// TODO: find correct LFSR algorithm
						noise_lfsr = (noise_lfsr >> 1) ^ (0xE008 & (unsigned)-(int)(noise_lfsr & 1));
						//noise_lfsr = (noise_lfsr >> 1) ^ (0x6000 & -(noise_lfsr & 1));
						int delta = new_dac - dac;
						if ( delta )
						{
							dac = new_dac;
							synth_.offset( time, delta * volume_0, osc_outputs_0 );
							if ( osc_outputs_1 )
								synth_.offset( time, delta * volume_1, osc_outputs_1 );
						}
						time += period;
					}
					while ( time < end_time );
					
					this->noise_lfsr = noise_lfsr;
					assert( noise_lfsr );
				}
			}
			else if ( !(control & 0x40) )
			{
				// wave
				int phase = (this->phase + 1) & 0x1F; // pre-advance for optimal inner loop
				int period = this->period * 2;
				if ( period >= 14 && (volume_0 | volume_1) )
				{
					do
					{
						int new_dac = wave [phase];
						phase = (phase + 1) & 0x1F;
						int delta = new_dac - dac;
						if ( delta )
						{
							dac = new_dac;
							synth_.offset( time, delta * volume_0, osc_outputs_0 );
							if ( osc_outputs_1 )
								synth_.offset( time, delta * volume_1, osc_outputs_1 );
						}
						time += period;
					}
					while ( time < end_time );
				}
				else
				{
					if ( !period )
					{
						// TODO: Gekisha Boy assumes that period = 0 silences wave
						//period = 0x1000 * 2;
						period = 1;
						//if ( !(volume_0 | volume_1) )
						//  debug_printf( "Used period 0\n" );
					}
					
					// maintain phase when silent
					blargg_long count = (end_time - time + period - 1) / period;
					phase += count; // phase will be masked below
					time += count * period;
				}
				this->phase = (phase - 1) & 0x1F; // undo pre-advance
			}
		}
		time -= end_time;
		if ( time < 0 )
			time = 0;
		delay = time;
		
		this->dac = dac;
		last_amp [0] = dac * volume_0;
		last_amp [1] = dac * volume_1;
	}
	last_time = end_time;
}